

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::TestMutualRecursionA::ByteSizeLong(TestMutualRecursionA *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  RepeatedPtrField<proto2_unittest::TestMutualRecursionA_SubGroupR> *this_00;
  reference value;
  uint32_t *puVar4;
  size_t sVar5;
  TestMutualRecursionA_SubGroupR *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<proto2_unittest::TestMutualRecursionA_SubGroupR> *__range2;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestMutualRecursionA *this_;
  TestMutualRecursionA *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar3 = _internal_subgroupr_size(this);
  sStack_58 = (long)iVar3 * 2;
  this_00 = _internal_subgroupr(this);
  __end2 = google::protobuf::RepeatedPtrField<proto2_unittest::TestMutualRecursionA_SubGroupR>::
           begin(this_00);
  msg = (TestMutualRecursionA_SubGroupR *)
        google::protobuf::RepeatedPtrField<proto2_unittest::TestMutualRecursionA_SubGroupR>::end
                  (this_00);
  while (bVar2 = google::protobuf::internal::operator!=(&__end2,(iterator *)&msg), bVar2) {
    value = google::protobuf::internal::
            RepeatedPtrIterator<const_proto2_unittest::TestMutualRecursionA_SubGroupR>::operator*
                      (&__end2);
    sVar5 = google::protobuf::internal::WireFormatLite::
            GroupSize<proto2_unittest::TestMutualRecursionA_SubGroupR>(value);
    sStack_58 = sVar5 + sStack_58;
    google::protobuf::internal::
    RepeatedPtrIterator<const_proto2_unittest::TestMutualRecursionA_SubGroupR>::operator++(&__end2);
  }
  puVar4 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar4;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::TestMutualRecursionB>((this->field_0)._impl_.bb_);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      sVar5 = google::protobuf::internal::WireFormatLite::
              GroupSize<proto2_unittest::TestMutualRecursionA_SubGroup>
                        ((this->field_0)._impl_.subgroup_);
      sStack_58 = sVar5 + 2 + sStack_58;
    }
  }
  sVar5 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t TestMutualRecursionA::ByteSizeLong() const {
  const TestMutualRecursionA& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestMutualRecursionA)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto2_unittest.TestMutualRecursionA.SubGroupR subgroupr = 5 [features = {
    {
      total_size += 2UL * this_._internal_subgroupr_size();
      for (const auto& msg : this_._internal_subgroupr()) {
        total_size += ::google::protobuf::internal::WireFormatLite::GroupSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // .proto2_unittest.TestMutualRecursionB bb = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.bb_);
    }
    // .proto2_unittest.TestMutualRecursionA.SubGroup subgroup = 2 [features = {
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::GroupSize(*this_._impl_.subgroup_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}